

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextengine.cpp
# Opt level: O0

void __thiscall QTextEngine::addRequiredBoundaries(QTextEngine *this)

{
  qsizetype qVar1;
  QTextEngine *this_00;
  long i_00;
  QList<QTextLayout::FormatRange> *in_RDI;
  FormatRange *r;
  int i;
  int local_c;
  
  if (in_RDI[10].d.size != 0) {
    local_c = 0;
    while( true ) {
      i_00 = (long)local_c;
      qVar1 = QList<QTextLayout::FormatRange>::size
                        ((QList<QTextLayout::FormatRange> *)(in_RDI[10].d.size + 0x20));
      if (qVar1 <= i_00) break;
      this_00 = (QTextEngine *)QList<QTextLayout::FormatRange>::at(in_RDI,i_00);
      setBoundary(this_00,(int)((ulong)in_RDI >> 0x20));
      setBoundary(this_00,(int)((ulong)in_RDI >> 0x20));
      local_c = local_c + 1;
    }
  }
  return;
}

Assistant:

void QTextEngine::addRequiredBoundaries() const
{
    if (specialData) {
        for (int i = 0; i < specialData->formats.size(); ++i) {
            const QTextLayout::FormatRange &r = specialData->formats.at(i);
            setBoundary(r.start);
            setBoundary(r.start + r.length);
            //qDebug("adding boundaries %d %d", r.start, r.start+r.length);
        }
    }
}